

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

void __thiscall OpenMD::Snapshot::wrapVector(Snapshot *this,Vector3d *pos)

{
  uint i_2;
  Mat3x3d *pMVar1;
  uint i;
  uint j;
  long lVar2;
  int i_1;
  long lVar3;
  double dVar4;
  double dVar5;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  double local_58 [4];
  double local_38 [4];
  
  if ((this->frameData).usePBC == true) {
    if ((this->frameData).orthoRhombic == true) {
      lVar3 = 0;
      do {
        dVar4 = *(double *)((long)(pos->super_Vector<double,_3U>).data_ + lVar3) *
                *(double *)
                 ((long)(this->frameData).invHmat.super_SquareMatrix<double,_3>.
                        super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3 * 4);
        if (0.0 <= dVar4) {
          dVar5 = floor(dVar4 + 0.5);
        }
        else {
          dVar5 = ceil(dVar4 + -0.5);
        }
        *(double *)((long)(pos->super_Vector<double,_3U>).data_ + lVar3) =
             (dVar4 - dVar5) *
             *(double *)
              ((long)(this->frameData).hmat.super_SquareMatrix<double,_3>.
                     super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3 * 4);
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x18);
    }
    else {
      pMVar1 = &(this->frameData).invHmat;
      local_58[0] = 0.0;
      local_58[1] = 0.0;
      local_58[2] = 0.0;
      lVar3 = 0;
      do {
        dVar4 = local_58[lVar3];
        lVar2 = 0;
        do {
          dVar4 = dVar4 + (pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar2] * (pos->super_Vector<double,_3U>).data_[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        local_58[lVar3] = dVar4;
        lVar3 = lVar3 + 1;
        pMVar1 = (Mat3x3d *)
                 ((pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                 );
      } while (lVar3 != 3);
      lVar3 = 0;
      do {
        dVar4 = local_58[lVar3];
        if (0.0 <= dVar4) {
          dVar5 = floor(dVar4 + 0.5);
        }
        else {
          dVar5 = ceil(dVar4 + -0.5);
        }
        local_58[lVar3] = dVar4 - dVar5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      pMVar1 = &(this->frameData).hmat;
      local_38[0] = 0.0;
      local_38[1] = 0.0;
      local_38[2] = 0.0;
      lVar3 = 0;
      do {
        dVar4 = local_38[lVar3];
        lVar2 = 0;
        do {
          dVar4 = dVar4 + (pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar2] * local_58[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        local_38[lVar3] = dVar4;
        lVar3 = lVar3 + 1;
        pMVar1 = (Mat3x3d *)
                 ((pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                 );
      } while (lVar3 != 3);
      (pos->super_Vector<double,_3U>).data_[2] = local_38[2];
      (pos->super_Vector<double,_3U>).data_[0] = local_38[0];
      (pos->super_Vector<double,_3U>).data_[1] = local_38[1];
    }
  }
  return;
}

Assistant:

void Snapshot::wrapVector(Vector3d& pos) {
    if (!frameData.usePBC) return;

    if (!frameData.orthoRhombic) {
      Vector3d scaled = frameData.invHmat * pos;
      for (int i = 0; i < 3; i++) {
        scaled[i] -= roundMe(scaled[i]);
      }
      // calc the wrapped real coordinates from the wrapped scaled coordinates
      pos = frameData.hmat * scaled;
    } else {
      RealType scaled;
      for (int i = 0; i < 3; i++) {
        scaled = pos[i] * frameData.invHmat(i, i);
        scaled -= roundMe(scaled);
        pos[i] = scaled * frameData.hmat(i, i);
      }
    }
  }